

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_joystick.c
# Opt level: O1

void pollJoystickEvents(void)

{
  byte bVar1;
  ulong in_RAX;
  int *piVar2;
  ssize_t sVar3;
  long lVar4;
  js_event e;
  undefined8 uStack_38;
  
  lVar4 = 0;
  uStack_38 = in_RAX;
  do {
    if (_glfw.x11.joystick[lVar4].present != 0) {
      piVar2 = __errno_location();
      while( true ) {
        *piVar2 = 0;
        sVar3 = read(_glfw.x11.joystick[lVar4].fd,&uStack_38,8);
        if (*piVar2 == 0x13) {
          free(_glfw.x11.joystick[lVar4].axes);
          free(_glfw.x11.joystick[lVar4].buttons);
          free(_glfw.x11.joystick[lVar4].name);
          _glfw.x11.joystick[lVar4].present = 0;
        }
        if (sVar3 == -1) break;
        bVar1 = uStack_38._6_1_ & 0x7f;
        uStack_38 = uStack_38 & 0xff7fffffffffffff;
        if (bVar1 == 1) {
          _glfw.x11.joystick[lVar4].buttons[uStack_38._7_1_] = uStack_38._4_2_ != 0;
        }
        else if (bVar1 == 2) {
          _glfw.x11.joystick[lVar4].axes[uStack_38._7_1_] = (float)(int)uStack_38._4_2_ / 32767.0;
        }
      }
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  return;
}

Assistant:

static void pollJoystickEvents(void)
{
#ifdef __linux__
    int i;
    ssize_t result;
    struct js_event e;

    for (i = 0;  i <= GLFW_JOYSTICK_LAST;  i++)
    {
        if (!_glfw.x11.joystick[i].present)
            continue;

        // Read all queued events (non-blocking)
        for (;;)
        {
            errno = 0;
            result = read(_glfw.x11.joystick[i].fd, &e, sizeof(e));

            if (errno == ENODEV)
            {
                free(_glfw.x11.joystick[i].axes);
                free(_glfw.x11.joystick[i].buttons);
                free(_glfw.x11.joystick[i].name);
                _glfw.x11.joystick[i].present = GL_FALSE;
            }

            if (result == -1)
                break;

            // We don't care if it's an init event or not
            e.type &= ~JS_EVENT_INIT;

            switch (e.type)
            {
                case JS_EVENT_AXIS:
                    _glfw.x11.joystick[i].axes[e.number] =
                        (float) e.value / 32767.0f;
                    break;

                case JS_EVENT_BUTTON:
                    _glfw.x11.joystick[i].buttons[e.number] =
                        e.value ? GLFW_PRESS : GLFW_RELEASE;
                    break;

                default:
                    break;
            }
        }
    }
#endif // __linux__
}